

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

Node * __thiscall llvm::yaml::KeyValueNode::getKey(KeyValueNode *this)

{
  TokenKind TVar1;
  unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *puVar2;
  char *pcVar3;
  Token *pTVar4;
  Node *pNVar5;
  Token local_50;
  
  if (this->Key != (Node *)0x0) {
    return this->Key;
  }
  pTVar4 = Scanner::peekNext(*(Scanner **)
                              &((((this->super_Node).Doc)->_M_t).
                                super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)
                               ->stream->scanner);
  TVar1 = pTVar4->Kind;
  if ((int)TVar1 < 0x10) {
    if ((TVar1 != TK_Error) && (TVar1 != TK_BlockEnd)) goto LAB_00da933c;
LAB_00da92e3:
    pNVar5 = (Node *)Node::operator_new(0x48,&((((this->super_Node).Doc)->_M_t).
                                               super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                               .super__Head_base<0UL,_llvm::yaml::Document_*,_false>
                                              ._M_head_impl)->NodeAllocator,0x10);
    if (pNVar5 == (Node *)0x0) goto LAB_00da93d8;
  }
  else {
    if (TVar1 == TK_Key) {
      Scanner::getNext(&local_50,
                       *(Scanner **)
                        &((((this->super_Node).Doc)->_M_t).
                          super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                          .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                         stream->scanner);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.Value._M_dataplus._M_p != &local_50.Value.field_2) {
        operator_delete(local_50.Value._M_dataplus._M_p,
                        local_50.Value.field_2._M_allocated_capacity + 1);
      }
    }
    else if (TVar1 == TK_Value) goto LAB_00da92e3;
LAB_00da933c:
    pTVar4 = Scanner::peekNext(*(Scanner **)
                                &((((this->super_Node).Doc)->_M_t).
                                  super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                  .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl
                                 )->stream->scanner);
    if ((pTVar4->Kind != TK_Value) && (pTVar4->Kind != TK_BlockEnd)) {
      pNVar5 = Document::parseBlockNode
                         ((((this->super_Node).Doc)->_M_t).
                          super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                          .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl);
      goto LAB_00da93d8;
    }
    pNVar5 = (Node *)Node::operator_new(0x48,&((((this->super_Node).Doc)->_M_t).
                                               super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                               .super__Head_base<0UL,_llvm::yaml::Document_*,_false>
                                              ._M_head_impl)->NodeAllocator,0x10);
    if (pNVar5 == (Node *)0x0) {
      pNVar5 = (Node *)0x0;
      goto LAB_00da93d8;
    }
  }
  puVar2 = (this->super_Node).Doc;
  pNVar5->_vptr_Node = (_func_int **)&PTR_anchor_01079770;
  pNVar5->Doc = puVar2;
  (pNVar5->SourceRange).Start.Ptr = (char *)0x0;
  (pNVar5->SourceRange).End.Ptr = (char *)0x0;
  pNVar5->TypeID = 0;
  (pNVar5->Anchor).Data = (char *)0x0;
  (pNVar5->Anchor).Length = 0;
  (pNVar5->Tag).Data = (char *)0x0;
  (pNVar5->Tag).Length = 0;
  pTVar4 = Scanner::peekNext(*(Scanner **)
                              &((puVar2->_M_t).
                                super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)
                               ->stream->scanner);
  pcVar3 = (pTVar4->Range).Data;
  (pNVar5->SourceRange).Start.Ptr = pcVar3;
  (pNVar5->SourceRange).End.Ptr = pcVar3;
  pNVar5->_vptr_Node = (_func_int **)&PTR_anchor_01079790;
LAB_00da93d8:
  this->Key = pNVar5;
  return pNVar5;
}

Assistant:

Node *KeyValueNode::getKey() {
  if (Key)
    return Key;
  // Handle implicit null keys.
  {
    Token &t = peekNext();
    if (   t.Kind == Token::TK_BlockEnd
        || t.Kind == Token::TK_Value
        || t.Kind == Token::TK_Error) {
      return Key = new (getAllocator()) NullNode(Doc);
    }
    if (t.Kind == Token::TK_Key)
      getNext(); // skip TK_Key.
  }

  // Handle explicit null keys.
  Token &t = peekNext();
  if (t.Kind == Token::TK_BlockEnd || t.Kind == Token::TK_Value) {
    return Key = new (getAllocator()) NullNode(Doc);
  }

  // We've got a normal key.
  return Key = parseBlockNode();
}